

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterActiveVariablesCase::iterate
          (AtomicCounterActiveVariablesCase *this)

{
  value_type vVar1;
  Program *programDefinition;
  code *pcVar2;
  GLint GVar3;
  GLenum GVar4;
  int iVar5;
  __type _Var6;
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  ulong uVar15;
  reference pvVar16;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar17;
  const_reference ppSVar18;
  DefaultBlock *pDVar19;
  reference pvVar20;
  MessageBuilder local_1b78;
  int local_19f8;
  int local_19f4;
  MessageBuilder local_19f0;
  MessageBuilder local_1870;
  int local_16f0;
  int local_16ec;
  int varBinding;
  int varNdx_2;
  int prevBinding;
  int nameNdx;
  byte local_155d;
  int local_155c;
  undefined1 local_1558 [3];
  bool bindingsValid;
  int varNdx_1;
  MessageBuilder builder_1;
  value_type local_13d0;
  MessageBuilder local_13b0;
  value_type local_1229;
  MessageBuilder local_1228;
  undefined1 local_10a8 [8];
  vector<char,_std::allocator<char>_> nameBuf;
  int local_1088;
  GLint written_1;
  GLint nameLength;
  GLenum nameLengthProp;
  int ndx;
  int varNdx;
  MessageBuilder builder;
  MessageBuilder local_d78;
  value_type_conflict1 local_bf4;
  MessageBuilder local_bf0;
  MessageBuilder local_a70;
  undefined4 local_8ec;
  MessageBuilder local_8e8;
  int local_768;
  int local_764;
  GLint written;
  GLint numActiveVariables;
  GLenum activeVariablesProp;
  GLenum numActiveVariablesProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  memberNames;
  vector<int,_std::allocator<int>_> activeVariables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  allocator<char> local_6e1;
  string local_6e0;
  ScopedLogSection local_6c0;
  ScopedLogSection section_1;
  undefined1 local_6b0 [4];
  int bufferNdx;
  MessageBuilder local_530;
  MessageBuilder local_3b0;
  int local_22c;
  int local_228;
  GLint queryMaxNumActiveVariables;
  GLint queryActiveResources;
  allocator<char> local_1f9;
  string local_1f8;
  ScopedLogSection local_1d8;
  ScopedLogSection section;
  int local_1c8;
  int expectedMaxNumActiveVariables;
  int numAtomicBuffers;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  Functions *gl;
  AtomicCounterActiveVariablesCase *this_local;
  
  pRVar9 = Context::getRenderContext((this->super_AtomicCounterCase).super_TestCase.m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar7);
  pRVar9 = Context::getRenderContext((this->super_AtomicCounterCase).super_TestCase.m_context);
  generateProgramInterfaceProgramSources(&local_1b8,(this->super_AtomicCounterCase).m_program);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,pRVar9,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  local_1c8 = AtomicCounterCase::getNumAtomicCounterBuffers(&this->super_AtomicCounterCase);
  section.m_log._4_4_ = AtomicCounterCase::getMaxNumActiveVariables(&this->super_AtomicCounterCase);
  tcu::TestContext::setTestResult
            ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  programDefinition = (this->super_AtomicCounterCase).m_program;
  pRVar9 = Context::getRenderContext((this->super_AtomicCounterCase).super_TestCase.m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_e8,programDefinition,
                     (Functions *)CONCAT44(extraout_var_00,iVar7),pTVar10);
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Interface",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&queryActiveResources,"ATOMIC_COUNTER_BUFFER interface",
             (allocator<char> *)((long)&queryMaxNumActiveVariables + 3));
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1d8,pTVar10,&local_1f8,(string *)&queryActiveResources);
  std::__cxx11::string::~string((string *)&queryActiveResources);
  std::allocator<char>::~allocator((allocator<char> *)((long)&queryMaxNumActiveVariables + 3));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  local_228 = -1;
  local_22c = -1;
  pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x990);
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  (*pcVar2)(dVar8,0x92c0,0x92f5,&local_228);
  pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x990);
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  (*pcVar2)(dVar8,0x92c0,0x92f7,&local_22c);
  dVar8 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar8,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x944);
  pTVar10 = tcu::TestContext::getLog
                      ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_3b0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [23])0xf4a032);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_228);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0xf12600);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [31])"GL_MAX_NUM_ACTIVE_VARIABLES = ")
  ;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_22c);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0xf12600);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b0);
  if (local_228 != local_1c8) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_530,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_530,
                         (char (*) [53])"Error, got unexpected GL_ACTIVE_RESOURCES, expected ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1c8);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_530);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_ACTIVE_RESOURCES");
  }
  if (local_22c != section.m_log._4_4_) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_6b0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_6b0,
                         (char (*) [61])
                         "Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)((long)&section.m_log + 4));
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6b0);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1d8);
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < local_1c8;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"Resource",&local_6e1);
    de::toString<int>((string *)
                      &activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(int *)((long)&section_1.m_log + 4)
                     );
    std::operator+(&local_708,"Resource index ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    tcu::ScopedLogSection::ScopedLogSection(&local_6c0,pTVar10,&local_6e0,&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string
              ((string *)
               &activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &memberNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&activeVariablesProp);
    numActiveVariables = 0x9304;
    written = 0x9305;
    local_764 = -2;
    local_768 = -1;
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
    dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    (*pcVar2)(dVar8,0x92c0,section_1.m_log._4_4_,1,&numActiveVariables,1,&local_768,&local_764);
    dVar8 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar8,"query num active variables",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x968);
    if (local_764 < 1) {
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8e8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_8e8,(char (*) [45])"Error, got unexpected NUM_ACTIVE_VARIABLES: ")
      ;
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_764);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8e8);
      tcu::TestContext::setTestResult
                ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected NUM_ACTIVE_VARIABLES");
      local_8ec = 4;
    }
    else if (local_768 < 1) {
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_a70,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_a70,
                           (char (*) [57])"Error, query for NUM_ACTIVE_VARIABLES returned no values"
                          );
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a70);
      tcu::TestContext::setTestResult
                ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"NUM_ACTIVE_VARIABLES query failed");
      local_8ec = 4;
    }
    else {
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_bf0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_bf0,(char (*) [27])"GL_NUM_ACTIVE_VARIABLES = ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_764);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bf0);
      local_768 = -1;
      local_bf4 = -2;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 &memberNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_764 + 1),
                 &local_bf4);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
      dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
      iVar5 = section_1.m_log._4_4_;
      iVar7 = local_764;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &memberNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      (*pcVar2)(dVar8,0x92c0,iVar5,1,&written,iVar7,&local_768,pvVar12);
      dVar8 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar8,"query active variables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x97e);
      if (local_768 == local_764) {
        pvVar12 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)
                             &memberNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (*pvVar12 == -2) {
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &memberNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx);
          tcu::MessageBuilder::MessageBuilder((MessageBuilder *)&ndx,pTVar10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&ndx,(char (*) [27])"Active variable indices: {");
          for (nameLengthProp = 0; GVar4 = nameLengthProp,
              sVar13 = std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)
                                  &memberNames.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
              (int)GVar4 < (int)sVar13; nameLengthProp = nameLengthProp + 1) {
            if (nameLengthProp != 0) {
              tcu::MessageBuilder::operator<<((MessageBuilder *)&ndx,(char (*) [3])0xf95514);
            }
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &memberNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)(int)nameLengthProp);
            tcu::MessageBuilder::operator<<((MessageBuilder *)&ndx,pvVar12);
          }
          pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)&ndx,(char (*) [2])0xf26f8f);
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
          for (nameLength = 0; GVar3 = nameLength,
              sVar13 = std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)
                                  &memberNames.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
              GVar3 < (int)sVar13; nameLength = nameLength + 1) {
            written_1 = 0x92f9;
            local_1088 = -1;
            nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0xffffffff;
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_10a8);
            pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
            dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &memberNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)nameLength);
            (*pcVar2)(dVar8,0x92e1,*pvVar12,1,&written_1,1,
                      &nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,
                      &local_1088);
            dVar8 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
            glu::checkError(dVar8,"query buffer variable name length",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                            ,0x9a8);
            if (((int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 1) ||
               (local_1088 == -1)) {
              pTVar10 = tcu::TestContext::getLog
                                  ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1228,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (&local_1228,
                                   (char (*) [51])
                                   "Error, query for GL_NAME_LENGTH returned no values");
              tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1228);
              tcu::TestContext::setTestResult
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"GL_NAME_LENGTH query failed")
              ;
              local_8ec = 10;
            }
            else {
              local_1229 = 'X';
              std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)local_10a8,(long)(local_1088 + 2),
                         &local_1229);
              nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0xffffffff;
              pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c0);
              dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &memberNames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)nameLength);
              vVar1 = *pvVar12;
              sVar13 = std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)local_10a8);
              pvVar14 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)local_10a8,0);
              (*pcVar2)(dVar8,0x92e1,vVar1,sVar13 & 0xffffffff,
                        &nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,
                        pvVar14);
              dVar8 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
              glu::checkError(dVar8,"query buffer variable name",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                              ,0x9b5);
              if ((int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 1) {
                pTVar10 = tcu::TestContext::getLog
                                    ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                                     super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_13b0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar11 = tcu::MessageBuilder::operator<<
                                    (&local_13b0,
                                     (char (*) [48])
                                     "Error, query for resource name returned no name");
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_13b0);
                tcu::TestContext::setTestResult
                          ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Name query failed");
                local_8ec = 10;
              }
              else {
                pvVar14 = std::vector<char,_std::allocator<char>_>::operator[]
                                    ((vector<char,_std::allocator<char>_> *)local_10a8,0);
                uVar15 = (ulong)(int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                     ._20_4_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_13d0,pvVar14,uVar15,(allocator *)&builder_1.field_0x17f)
                ;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&activeVariablesProp,&local_13d0);
                std::__cxx11::string::~string((string *)&local_13d0);
                std::allocator<char>::~allocator((allocator<char> *)&builder_1.field_0x17f);
                local_8ec = 0;
              }
            }
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_10a8);
          }
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx);
          tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_1558,pTVar10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1558,(char (*) [19])"Active variables:\n");
          for (local_155c = 0; iVar7 = local_155c,
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&activeVariablesProp), iVar7 < (int)sVar13;
              local_155c = local_155c + 1) {
            pMVar11 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1558,(char (*) [2])0xf2b66e);
            pvVar16 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&activeVariablesProp,(long)local_155c);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,pvVar16);
            tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0xf12600);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1558);
          local_155d = 1;
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&prevBinding,pTVar10,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&prevBinding,(char (*) [16])"Verifying names");
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&prevBinding);
          for (varNdx_2 = 0; iVar7 = varNdx_2,
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&activeVariablesProp), iVar7 < (int)sVar13; varNdx_2 = varNdx_2 + 1
              ) {
            varBinding = -1;
            local_16ec = 0;
            while( true ) {
              iVar7 = local_16ec;
              pvVar17 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_AtomicCounterCase).m_program);
              ppSVar18 = std::
                         vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         ::operator[](pvVar17,0);
              pDVar19 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar18);
              sVar13 = std::
                       vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                       size(&pDVar19->variables);
              if ((int)sVar13 <= iVar7) break;
              pvVar17 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_AtomicCounterCase).m_program);
              ppSVar18 = std::
                         vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         ::operator[](pvVar17,0);
              pDVar19 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar18);
              pvVar20 = std::
                        vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ::operator[](&pDVar19->variables,(long)local_16ec);
              pvVar16 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&activeVariablesProp,(long)varNdx_2);
              _Var6 = std::operator==(&pvVar20->name,pvVar16);
              iVar7 = varBinding;
              if (_Var6) {
                pvVar17 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_AtomicCounterCase).m_program);
                ppSVar18 = std::
                           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                           ::operator[](pvVar17,0);
                pDVar19 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar18);
                pvVar20 = std::
                          vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                          ::operator[](&pDVar19->variables,(long)local_16ec);
                local_16f0 = (pvVar20->layout).binding;
                iVar7 = local_16f0;
                if ((varBinding != -1) && (iVar7 = local_16f0, varBinding != local_16f0)) {
                  local_155d = 0;
                  iVar7 = varBinding;
                }
              }
              varBinding = iVar7;
              local_16ec = local_16ec + 1;
            }
            if (varBinding == -1) {
              pTVar10 = tcu::TestContext::getLog
                                  ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1870,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (&local_1870,
                                   (char (*) [43])"Error, could not find variable with name \"");
              pvVar16 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&activeVariablesProp,(long)varNdx_2);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,pvVar16);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0xf09e4c);
              tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1870);
              tcu::TestContext::setTestResult
                        ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Variable name invalid");
            }
            else {
              iVar7 = AtomicCounterCase::getBufferVariableCount
                                (&this->super_AtomicCounterCase,varBinding);
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&activeVariablesProp);
              if (iVar7 != (int)sVar13) {
                pTVar10 = tcu::TestContext::getLog
                                    ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                                     super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_19f0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar11 = tcu::MessageBuilder::operator<<
                                    (&local_19f0,
                                     (char (*) [46])"Error, unexpected variable count for binding ")
                ;
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&varBinding);
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])0xf10854);
                local_19f4 = AtomicCounterCase::getBufferVariableCount
                                       (&this->super_AtomicCounterCase,varBinding);
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_19f4);
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [7])0xf925e6);
                sVar13 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&activeVariablesProp);
                local_19f8 = (int)sVar13;
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_19f8);
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_19f0);
                tcu::TestContext::setTestResult
                          ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Variable names invalid");
              }
            }
          }
          if ((local_155d & 1) == 0) {
            pTVar10 = tcu::TestContext::getLog
                                ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      (&local_1b78,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_1b78,
                                 (char (*) [49])"Error, all resource do not share the same buffer");
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1b78);
            tcu::TestContext::setTestResult
                      ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx,QP_TEST_RESULT_FAIL,"Active variables invalid");
            local_8ec = 4;
          }
          else {
            local_8ec = 0;
          }
        }
        else {
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&builder.field_0x178,pTVar10,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&builder.field_0x178,
                               (char (*) [66])
                               "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds");
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&builder.field_0x178);
          tcu::TestContext::setTestResult
                    ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,"ACTIVE_VARIABLES query failed");
          local_8ec = 4;
        }
      }
      else {
        pTVar10 = tcu::TestContext::getLog
                            ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_d78,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_d78,
                             (char (*) [70])
                             "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = "
                            );
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_764);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [18])", query returned ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_768);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [8])0xf4aa67);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d78);
        tcu::TestContext::setTestResult
                  ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected ACTIVE_VARIABLES");
        local_8ec = 4;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&activeVariablesProp);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &memberNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::ScopedLogSection::~ScopedLogSection(&local_6c0);
  }
  local_8ec = 1;
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return STOP;
}

Assistant:

AtomicCounterActiveVariablesCase::IterateResult AtomicCounterActiveVariablesCase::iterate (void)
{
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const int					numAtomicBuffers				= getNumAtomicCounterBuffers();
	const int					expectedMaxNumActiveVariables	= getMaxNumActiveVariables();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// check active variables
	{
		const tcu::ScopedLogSection	section						(m_testCtx.getLog(), "Interface", "ATOMIC_COUNTER_BUFFER interface");
		glw::GLint					queryActiveResources		= -1;
		glw::GLint					queryMaxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, &queryActiveResources);
		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, &queryMaxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_ACTIVE_RESOURCES = " << queryActiveResources << "\n"
			<< "GL_MAX_NUM_ACTIVE_VARIABLES = " << queryMaxNumActiveVariables << "\n"
			<< tcu::TestLog::EndMessage;

		if (queryActiveResources != numAtomicBuffers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_ACTIVE_RESOURCES, expected " << numAtomicBuffers << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_ACTIVE_RESOURCES");
		}

		if (queryMaxNumActiveVariables != expectedMaxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected " << expectedMaxNumActiveVariables << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
		}
	}

	// Check each buffer
	for (int bufferNdx = 0; bufferNdx < numAtomicBuffers; ++bufferNdx)
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Resource", "Resource index " + de::toString(bufferNdx));
		std::vector<glw::GLint>		activeVariables;
		std::vector<std::string>	memberNames;

		// Find active variables
		{
			const glw::GLenum	numActiveVariablesProp	= GL_NUM_ACTIVE_VARIABLES;
			const glw::GLenum	activeVariablesProp		= GL_ACTIVE_VARIABLES;
			glw::GLint			numActiveVariables		= -2;
			glw::GLint			written					= -1;

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &numActiveVariablesProp, 1, &written, &numActiveVariables);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query num active variables");

			if (numActiveVariables <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected NUM_ACTIVE_VARIABLES: " << numActiveVariables  << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected NUM_ACTIVE_VARIABLES");
				continue;
			}

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for NUM_ACTIVE_VARIABLES returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_NUM_ACTIVE_VARIABLES = " << numActiveVariables << tcu::TestLog::EndMessage;

			written = -1;
			activeVariables.resize(numActiveVariables + 1, -2);

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &activeVariablesProp, numActiveVariables, &written, &activeVariables[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query active variables");

			if (written != numActiveVariables)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = " << numActiveVariables << ", query returned " << written << " values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected ACTIVE_VARIABLES");
				continue;
			}

			if (activeVariables.back() != -2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "ACTIVE_VARIABLES query failed");
				continue;
			}

			activeVariables.pop_back();
		}

		// log indices
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variable indices: {";
			for (int varNdx = 0; varNdx < (int)activeVariables.size(); ++varNdx)
			{
				if (varNdx)
					builder << ", ";
				builder << activeVariables[varNdx];
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		// collect member names
		for (int ndx = 0; ndx < (int)activeVariables.size(); ++ndx)
		{
			const glw::GLenum	nameLengthProp	= GL_NAME_LENGTH;
			glw::GLint			nameLength		= -1;
			glw::GLint			written			= -1;
			std::vector<char>	nameBuf;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, activeVariables[ndx], 1, &nameLengthProp, 1, &written, &nameLength);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name length");

			if (written <= 0 || nameLength == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for GL_NAME_LENGTH returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
				continue;
			}

			nameBuf.resize(nameLength + 2, 'X'); // +2 to tolerate potential off-by-ones in some implementations, name queries will check these cases better
			written = -1;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, activeVariables[ndx], (int)nameBuf.size(), &written, &nameBuf[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name");

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource name returned no name" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Name query failed");
				continue;
			}

			memberNames.push_back(std::string(&nameBuf[0], written));
		}

		// log names
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variables:\n";
			for (int varNdx = 0; varNdx < (int)memberNames.size(); ++varNdx)
			{
				builder << "\t" << memberNames[varNdx] << "\n";
			}
			builder << tcu::TestLog::EndMessage;
		}

		// check names are all in the same buffer
		{
			bool bindingsValid = true;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying names" << tcu::TestLog::EndMessage;

			for (int nameNdx = 0; nameNdx < (int)memberNames.size(); ++nameNdx)
			{
				int prevBinding = -1;

				for (int varNdx = 0; varNdx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++varNdx)
				{
					if (m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].name == memberNames[nameNdx])
					{
						const int varBinding = m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].layout.binding;

						if (prevBinding == -1 || prevBinding == varBinding)
							prevBinding = varBinding;
						else
							bindingsValid = false;
					}
				}

				if (prevBinding == -1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, could not find variable with name \"" << memberNames[nameNdx] << "\"" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable name invalid");
				}
				else if (getBufferVariableCount(prevBinding) != (int)memberNames.size())
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Error, unexpected variable count for binding " << prevBinding
						<< ". Expected " << getBufferVariableCount(prevBinding) << ", got " << (int)memberNames.size()
						<< tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable names invalid");
				}
			}

			if (!bindingsValid)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, all resource do not share the same buffer" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Active variables invalid");
				continue;
			}
		}
	}

	return STOP;
}